

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_database_size.cpp
# Opt level: O2

void duckdb::PragmaDatabaseSizeFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  AttachedDatabase *this;
  idx_t iVar1;
  bool bVar2;
  GlobalTableFunctionState *pGVar3;
  reference pvVar4;
  Catalog *pCVar5;
  reference pvVar6;
  long lVar7;
  _func_int **pp_Var8;
  ulong index;
  DatabaseSize ds;
  LogicalType local_e8;
  Value local_d0;
  string local_90;
  string local_70;
  string local_50;
  
  pGVar3 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  pp_Var8 = pGVar3[1]._vptr_GlobalTableFunctionState;
  index = 0;
  while ((pp_Var8 < (_func_int **)
                    ((long)pGVar3[3]._vptr_GlobalTableFunctionState -
                     (long)pGVar3[2]._vptr_GlobalTableFunctionState >> 3) && (index < 0x800))) {
    pvVar4 = vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::get<true>
                       ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *)
                        (pGVar3 + 2),(size_type)pp_Var8);
    this = pvVar4->_M_data;
    bVar2 = AttachedDatabase::IsSystem(this);
    if (!bVar2) {
      bVar2 = AttachedDatabase::IsTemporary(this);
      if (!bVar2) {
        pCVar5 = AttachedDatabase::GetCatalog(this);
        pp_Var8 = pCVar5->_vptr_Catalog;
        (*pp_Var8[0x13])(&ds,pCVar5,context);
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,0);
        ::std::__cxx11::string::string
                  ((string *)&local_50,(string *)&(this->super_CatalogEntry).name);
        Value::Value(&local_d0,&local_50);
        Vector::SetValue(pvVar6,index,&local_d0);
        Value::~Value(&local_d0);
        ::std::__cxx11::string::~string((string *)&local_50);
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,1);
        StringUtil::BytesToHumanReadableString_abi_cxx11_
                  (&local_70,(StringUtil *)ds.bytes,0x400,(idx_t)pp_Var8);
        Value::Value(&local_d0,&local_70);
        Vector::SetValue(pvVar6,index,&local_d0);
        Value::~Value(&local_d0);
        ::std::__cxx11::string::~string((string *)&local_70);
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,2);
        lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(ds.block_size);
        Value::BIGINT(&local_d0,lVar7);
        Vector::SetValue(pvVar6,index,&local_d0);
        Value::~Value(&local_d0);
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,3);
        lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(ds.total_blocks);
        Value::BIGINT(&local_d0,lVar7);
        Vector::SetValue(pvVar6,index,&local_d0);
        Value::~Value(&local_d0);
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,4);
        lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(ds.used_blocks);
        Value::BIGINT(&local_d0,lVar7);
        Vector::SetValue(pvVar6,index,&local_d0);
        Value::~Value(&local_d0);
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,5);
        lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(ds.free_blocks);
        Value::BIGINT(&local_d0,lVar7);
        Vector::SetValue(pvVar6,index,&local_d0);
        Value::~Value(&local_d0);
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,6);
        iVar1 = ds.wal_size;
        if (ds.wal_size == 0xffffffffffffffff) {
          LogicalType::LogicalType(&local_e8,SQLNULL);
          Value::Value(&local_d0,&local_e8);
        }
        else {
          StringUtil::BytesToHumanReadableString_abi_cxx11_
                    (&local_90,(StringUtil *)ds.wal_size,0x400,(idx_t)pp_Var8);
          Value::Value(&local_d0,&local_90);
        }
        Vector::SetValue(pvVar6,index,&local_d0);
        Value::~Value(&local_d0);
        if (iVar1 == 0xffffffffffffffff) {
          LogicalType::~LogicalType(&local_e8);
        }
        else {
          ::std::__cxx11::string::~string((string *)&local_90);
        }
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,7);
        Vector::SetValue(pvVar6,index,(Value *)(pGVar3 + 5));
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,8);
        Vector::SetValue(pvVar6,index,(Value *)(pGVar3 + 0xd));
        index = index + 1;
      }
    }
    pp_Var8 = (_func_int **)((long)pGVar3[1]._vptr_GlobalTableFunctionState + 1);
    pGVar3[1]._vptr_GlobalTableFunctionState = pp_Var8;
  }
  output->count = index;
  return;
}

Assistant:

void PragmaDatabaseSizeFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<PragmaDatabaseSizeData>();
	idx_t row = 0;
	for (; data.index < data.databases.size() && row < STANDARD_VECTOR_SIZE; data.index++) {
		auto &db = data.databases[data.index].get();
		if (db.IsSystem() || db.IsTemporary()) {
			continue;
		}
		auto ds = db.GetCatalog().GetDatabaseSize(context);
		idx_t col = 0;
		output.data[col++].SetValue(row, Value(db.GetName()));
		output.data[col++].SetValue(row, Value(StringUtil::BytesToHumanReadableString(ds.bytes)));
		output.data[col++].SetValue(row, Value::BIGINT(NumericCast<int64_t>(ds.block_size)));
		output.data[col++].SetValue(row, Value::BIGINT(NumericCast<int64_t>(ds.total_blocks)));
		output.data[col++].SetValue(row, Value::BIGINT(NumericCast<int64_t>(ds.used_blocks)));
		output.data[col++].SetValue(row, Value::BIGINT(NumericCast<int64_t>(ds.free_blocks)));
		output.data[col++].SetValue(
		    row, ds.wal_size == idx_t(-1) ? Value() : Value(StringUtil::BytesToHumanReadableString(ds.wal_size)));
		output.data[col++].SetValue(row, data.memory_usage);
		output.data[col++].SetValue(row, data.memory_limit);
		row++;
	}
	output.SetCardinality(row);
}